

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

ptls_openssl_signature_scheme_t *
ptls_openssl_select_signature_scheme
          (ptls_openssl_signature_scheme_t *available,uint16_t *algorithms,size_t num_algorithms)

{
  uint16_t *puVar1;
  size_t sVar2;
  ptls_openssl_signature_scheme_t *ppVar3;
  ptls_openssl_signature_scheme_t *scheme;
  uint16_t uVar4;
  ptls_openssl_signature_scheme_t *in_R9;
  bool bVar5;
  
  uVar4 = available->scheme_id;
  if (uVar4 != 0xffff) {
    do {
      ppVar3 = in_R9;
      bVar5 = num_algorithms == 0;
      if ((num_algorithms != 0) && (ppVar3 = available, *algorithms != uVar4)) {
        sVar2 = 1;
        do {
          bVar5 = num_algorithms == sVar2;
          ppVar3 = in_R9;
          if (bVar5) break;
          puVar1 = algorithms + sVar2;
          ppVar3 = available;
          sVar2 = sVar2 + 1;
        } while (*puVar1 != uVar4);
      }
      if (!bVar5) {
        return ppVar3;
      }
      uVar4 = available[1].scheme_id;
      available = available + 1;
      in_R9 = ppVar3;
    } while (uVar4 != 0xffff);
  }
  return (ptls_openssl_signature_scheme_t *)0x0;
}

Assistant:

const ptls_openssl_signature_scheme_t *ptls_openssl_select_signature_scheme(const ptls_openssl_signature_scheme_t *available,
                                                                            const uint16_t *algorithms, size_t num_algorithms)
{
    const ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm, driven by server-isde preference of `available` */
    for (scheme = available; scheme->scheme_id != UINT16_MAX; ++scheme)
        for (size_t i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                return scheme;

    return NULL;
}